

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

void If_Dec7MoveTo(word *t,int v,int p,int *Pla2Var,int *Var2Pla)

{
  int iVar1;
  ulong *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  
  if (Var2Pla[v] < p) {
    __assert_fail("Var2Pla[v] >= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x111,"void If_Dec7MoveTo(word *, int, int, int *, int *)");
  }
  iVar3 = Var2Pla[v];
  while (iVar3 != p) {
    iVar1 = iVar3 + -1;
    if (iVar1 == 5) {
      puVar2 = (ulong *)((long)t + 4);
      *puVar2 = *puVar2 << 0x20 | *puVar2 >> 0x20;
    }
    else {
      if (5 < iVar3) {
        __assert_fail("v < 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                      ,0x10a,"void If_Dec7SwapAdjacent(word *, int)");
      }
      uVar6 = PMasks[iVar1][0];
      uVar7 = PMasks[iVar1][1];
      uVar8 = *t;
      uVar9 = t[1];
      bVar11 = (byte)(1 << ((byte)iVar1 & 0x1f));
      uVar10 = PMasks[iVar1][2];
      *t = (uVar8 & uVar10) >> (bVar11 & 0x3f) | (uVar7 & uVar8) << (bVar11 & 0x3f) | uVar6 & uVar8;
      t[1] = (uVar9 & uVar10) >> (bVar11 & 0x3f) |
             (uVar7 & uVar9) << (bVar11 & 0x3f) | uVar6 & uVar9;
    }
    Var2Pla[Pla2Var[iVar1]] = Var2Pla[Pla2Var[iVar1]] + 1;
    Var2Pla[Pla2Var[iVar3]] = Var2Pla[Pla2Var[iVar3]] + -1;
    uVar4 = Pla2Var[iVar3];
    uVar5 = Pla2Var[iVar1];
    Pla2Var[iVar1] = uVar5 ^ uVar4;
    Pla2Var[iVar3] = uVar5;
    Pla2Var[iVar1] = uVar4;
    iVar3 = Var2Pla[v];
  }
  if (Pla2Var[(uint)p] == v) {
    return;
  }
  __assert_fail("Pla2Var[p] == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                ,0x11d,"void If_Dec7MoveTo(word *, int, int, int *, int *)");
}

Assistant:

static inline void If_Dec7MoveTo( word t[2], int v, int p, int Pla2Var[7], int Var2Pla[7] )
{
    int iPlace0, iPlace1;
    assert( Var2Pla[v] >= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        If_Dec7SwapAdjacent( t, iPlace0 );
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
    }
    assert( Pla2Var[p] == v );
}